

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_radio.c
# Opt level: O1

void radio_set(t_radio *x,t_floatarg f)

{
  int iVar1;
  int iVar2;
  int old;
  
  x->x_fval = f;
  iVar2 = 0;
  if (0 < (int)f) {
    iVar2 = (int)f;
  }
  iVar1 = x->x_number + -1;
  if (iVar2 < x->x_number) {
    iVar1 = iVar2;
  }
  iVar2 = x->x_on_old;
  if (x->x_on == iVar2) {
    x->x_on = iVar1;
    (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,0);
    return;
  }
  x->x_on_old = x->x_on;
  x->x_on = iVar1;
  (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,0);
  x->x_on_old = iVar2;
  return;
}

Assistant:

static void radio_set(t_radio *x, t_floatarg f)
{
    int i = (int)f;

    x->x_fval = f;
    if(i < 0)
        i = 0;
    if(i >= x->x_number)
        i = x->x_number - 1;
    if(x->x_on != x->x_on_old)
    {
        int old = x->x_on_old;
        x->x_on_old = x->x_on;
        x->x_on = i;
        (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_UPDATE);
        x->x_on_old = old;
    }
    else
    {
        x->x_on = i;
        (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_UPDATE);
    }
}